

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::setEnterBound4Row(SPxSolverBase<double> *this,int i,int n)

{
  Status SVar1;
  double *pdVar2;
  pointer pdVar3;
  long lVar4;
  
  SVar1 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[n];
  if (SVar1 == P_FIXED) {
    pdVar2 = (double *)infinity();
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] = -*pdVar2;
  }
  else {
    if (SVar1 != P_ON_UPPER) {
      if (SVar1 == P_ON_LOWER) {
        pdVar2 = (double *)infinity();
        (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[i] = -*pdVar2;
        pdVar3 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + n;
        lVar4 = 0x670;
      }
      else {
        (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[i] =
             (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[n];
        pdVar3 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + n;
        lVar4 = 0x688;
      }
      goto LAB_001a20d2;
    }
    (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[i] =
         (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[n];
  }
  lVar4 = 0x670;
  pdVar3 = (pointer)infinity();
LAB_001a20d2:
  *(double *)
   (*(long *)((long)&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                     _vptr_ClassArray + lVar4) + (long)i * 8) = *pdVar3;
  return;
}

Assistant:

void SPxSolverBase<R>::setEnterBound4Row(int i, int n)
{
   assert(this->baseId(i).isSPxRowId());
   assert(this->number(SPxRowId(this->baseId(i))) == n);

   switch(this->desc().rowStatus(n))
   {
   case SPxBasisBase<R>::Desc::P_ON_LOWER :
      theLBbound[i] = R(-infinity);
      theUBbound[i] = theURbound[n];
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
      theLBbound[i] = theLRbound[n];
      theUBbound[i] = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_FIXED:
      theLBbound[i] = R(-infinity);
      theUBbound[i] = R(infinity);
      break;

   default:
      theUBbound[i] = theURbound[n];
      theLBbound[i] = theLRbound[n];
      break;
   }
}